

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

Status __thiscall leveldb::anon_unknown_1::PosixEnv::DeleteDir(PosixEnv *this,string *name)

{
  int iVar1;
  int *piVar2;
  _func_int **pp_Var3;
  string *in_RDX;
  char *local_20;
  
  (this->super_Env)._vptr_Env = (_func_int **)0x0;
  iVar1 = rmdir((in_RDX->_M_dataplus)._M_p);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    IOError((anon_unknown_1 *)&local_20,in_RDX,*piVar2);
    if (local_20 != (char *)0x0) {
      if (local_20 == (char *)0x0) {
        pp_Var3 = (_func_int **)0x0;
      }
      else {
        pp_Var3 = (_func_int **)Status::CopyState(local_20);
      }
      (this->super_Env)._vptr_Env = pp_Var3;
    }
    if (local_20 != (char *)0x0) {
      operator_delete__(local_20);
    }
  }
  return (Status)(char *)this;
}

Assistant:

virtual Status DeleteDir(const std::string &name) {
                Status result;
                if (rmdir(name.c_str()) != 0) {
                    result = IOError(name, errno);
                }
                return result;
            }